

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miam.c
# Opt level: O0

void * la_miam_file_tmp_key_get(void *msg_info)

{
  undefined8 *puVar1;
  undefined8 *in_RDI;
  la_miam_file_key *key;
  la_miam_file_key *msg;
  char *in_stack_00000030;
  int in_stack_0000003c;
  char *in_stack_00000040;
  size_t in_stack_00000048;
  size_t in_stack_00000050;
  
  puVar1 = (undefined8 *)
           la_xcalloc(in_stack_00000050,in_stack_00000048,in_stack_00000040,in_stack_0000003c,
                      in_stack_00000030);
  *puVar1 = *in_RDI;
  *(undefined2 *)(puVar1 + 1) = *(undefined2 *)(in_RDI + 1);
  return puVar1;
}

Assistant:

static void *la_miam_file_tmp_key_get(void const *msg_info) {
	la_assert(msg_info != NULL);
	la_miam_file_key const *msg = msg_info;
	LA_NEW(la_miam_file_key, key);
	key->reg = (char *)msg->reg;
	key->file_id = msg->file_id;
	return (void *)key;
}